

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QUtil::read_lines_from_file_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QUtil *this,FILE *f,bool preserve_eol)

{
  function<bool_(char_&)> local_48;
  anon_class_8_1_54a39806 local_28;
  anon_class_8_1_54a39806 next_char;
  QUtil *pQStack_18;
  bool preserve_eol_local;
  FILE *f_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  next_char.f._7_1_ = (byte)f & 1;
  next_char.f._6_1_ = 0;
  pQStack_18 = this;
  f_local = (FILE *)__return_storage_ptr__;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  local_28.f = (FILE **)&stack0xffffffffffffffe8;
  std::function<bool(char&)>::
  function<QUtil::read_lines_from_file[abi:cxx11](_IO_FILE*,bool)::__0&,void>
            ((function<bool(char&)> *)&local_48,&local_28);
  read_lines_from_file(&local_48,__return_storage_ptr__,(bool)(next_char.f._7_1_ & 1));
  std::function<bool_(char_&)>::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string>
QUtil::read_lines_from_file(FILE* f, bool preserve_eol)
{
    std::list<std::string> lines;
    auto next_char = [&f](char& ch) { return read_char_from_FILE(ch, f); };
    read_lines_from_file(next_char, lines, preserve_eol);
    return lines;
}